

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

void xmlMutexLock(xmlMutexPtr tok)

{
  if (tok == (xmlMutexPtr)0x0) {
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)tok);
  return;
}

Assistant:

void
xmlMutexLock(xmlMutexPtr tok)
{
    if (tok == NULL)
        return;
#ifdef HAVE_POSIX_THREADS
    /*
     * This assumes that __libc_single_threaded won't change while the
     * lock is held.
     */
    pthread_mutex_lock(&tok->lock);
#elif defined HAVE_WIN32_THREADS
    EnterCriticalSection(&tok->cs);
#endif

}